

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer_tests.cc
# Opt level: O0

vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_> *
__thiscall
lf::io::test::
MeshFunctionLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/test/vtk_writer_tests.cc:276:44)>
::operator()(vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             *__return_storage_ptr__,
            MeshFunctionLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_io_test_vtk_writer_tests_cc:276:44)>
            *this,Entity *e,MatrixXd *x)

{
  size_type __n;
  long lVar1;
  Index IVar2;
  reference this_00;
  ConstColXpr local_a0;
  Matrix<float,_3,_1,_0,_3,_1> local_64;
  int local_58;
  int i;
  allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_41;
  undefined1 local_40 [8];
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  result;
  MatrixXd *x_local;
  Entity *e_local;
  MeshFunctionLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_io_test_vtk_writer_tests_cc:276:44)>
  *this_local;
  
  result.
  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)x;
  __n = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                  (&x->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::allocator(&local_41);
  std::
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            *)local_40,__n,&local_41);
  std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::~allocator(&local_41);
  local_58 = 0;
  while( true ) {
    lVar1 = (long)local_58;
    IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       result.
                       super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (IVar2 <= lVar1) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_a0,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               result.
               super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_58);
    test::lf_io_VtkWriter_twoElementMeshCodim0AllData_Test::TestBody()::$_20::operator()
              (&local_64,(Entity *)this,
               (Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)e);
    this_00 = std::
              vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ::operator[]((vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                            *)local_40,(long)local_58);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::operator=(this_00,&local_64);
    local_58 = local_58 + 1;
  }
  std::
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ::vector(__return_storage_ptr__,
           (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            *)local_40);
  std::
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             *)local_40);
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const mesh::Entity& e, const Eigen::MatrixXd& x) const {
    std::vector<std::invoke_result_t<F, const mesh::Entity&, Eigen::Matrix2d>>
        result(x.cols());
    for (int i = 0; i < x.cols(); ++i) {
      result[i] = f_(e, x.col(i));
    }
    return result;
  }